

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

void roaring_bitmap_lazy_or_inplace
               (roaring_bitmap_t *x1,roaring_bitmap_t *x2,_Bool bitsetconversion)

{
  int iVar1;
  container_t *c;
  ulong uVar2;
  array_container_t *sc;
  array_container_t *paVar3;
  byte bVar4;
  ulong uVar5;
  uint16_t *puVar6;
  undefined7 in_register_00000011;
  ushort key;
  roaring_array_t *ra;
  int32_t i;
  uint uVar7;
  int iVar8;
  byte bVar9;
  ulong uVar10;
  int iVar11;
  int iVar12;
  long lVar13;
  uint8_t type2;
  uint8_t type1;
  uint8_t result_type;
  uint8_t local_87;
  byte local_86;
  uint8_t local_85;
  int local_84;
  ulong local_80;
  long local_78;
  array_container_t *local_70;
  array_container_t *local_68;
  ulong local_60;
  roaring_array_t *local_58;
  undefined4 local_4c;
  ulong local_48;
  ulong local_40;
  long local_38;
  
  local_85 = '\0';
  local_84 = (x2->high_low_container).size;
  if (local_84 == 0) {
    return;
  }
  uVar7 = (x1->high_low_container).size;
  if (uVar7 == 0) {
    ra_overwrite(&x2->high_low_container,&x1->high_low_container,
                 (_Bool)((x2->high_low_container).flags & 1));
    return;
  }
  local_4c = (undefined4)CONCAT71(in_register_00000011,bitsetconversion);
  puVar6 = (x1->high_low_container).keys;
  key = *(x2->high_low_container).keys;
  local_48 = (ulong)(1 - local_84);
  local_40 = 0;
  uVar2 = 0;
  local_58 = &x1->high_low_container;
  do {
    local_60 = (ulong)uVar7;
    local_68 = (array_container_t *)CONCAT62(local_68._2_6_,*puVar6);
    iVar12 = (int)local_40;
    uVar10 = local_40 & 0xffffffff;
    local_70 = (array_container_t *)(local_48 + uVar10);
    local_78 = (long)iVar12;
    local_38 = local_78 * 8;
    local_80 = uVar2 & 0xffffffff;
    lVar13 = 0;
    while( true ) {
      ra = local_58;
      uVar2 = uVar10 + lVar13;
      iVar11 = (int)lVar13;
      i = (int32_t)(local_80 + lVar13);
      if ((ushort)local_68 == key) break;
      if ((ushort)local_68 < key) {
        uVar2 = local_80 + lVar13 + 1;
        iVar8 = (int)local_60;
        if (iVar8 + iVar11 != (uint)uVar2) {
          puVar6 = (uint16_t *)((ulong)(((uint)uVar2 & 0xffff) * 2) + (long)local_58->keys);
          local_40 = uVar10 + lVar13 & 0xffffffff;
          goto LAB_00115770;
        }
        iVar12 = iVar11 + iVar12;
        goto LAB_0011579b;
      }
      local_87 = (x2->high_low_container).typecodes[uVar2 & 0xffff];
      c = get_copy_of_container
                    ((x2->high_low_container).containers[uVar2 & 0xffff],&local_87,
                     (_Bool)((x2->high_low_container).flags & 1));
      ra = local_58;
      if (((x2->high_low_container).flags & 1) != 0) {
        if ((x2->high_low_container).size <= (int)uVar2) goto LAB_0011580a;
        *(container_t **)((long)(x2->high_low_container).containers + lVar13 * 8 + local_38) = c;
        (x2->high_low_container).typecodes[lVar13 + local_78] = local_87;
      }
      ra_insert_new_key_value_at(local_58,i,key,c,local_87);
      if ((int)local_70 + iVar11 == 0) {
        iVar1 = (int)local_80;
        iVar8 = (int)local_60 + iVar11 + 1;
        iVar12 = local_84;
        goto LAB_00115797;
      }
      key = (x2->high_low_container).keys[(ushort)((short)uVar10 + (short)lVar13 + 1)];
      lVar13 = lVar13 + 1;
    }
    uVar5 = local_80 + lVar13 & 0xffff;
    bVar9 = local_58->typecodes[uVar5];
    sc = (array_container_t *)local_58->containers[uVar5];
    paVar3 = sc;
    bVar4 = bVar9;
    local_86 = bVar9;
    if (bVar9 == 4) {
      bVar4 = *(byte *)&sc->array;
      if (bVar4 == 4) {
        __assert_fail("*type != SHARED_CONTAINER_TYPE",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                      ,0x1062,
                      "const container_t *container_unwrap_shared(const container_t *, uint8_t *)");
      }
      paVar3 = *(array_container_t **)sc;
    }
    if (bVar4 == 3) {
      if (((paVar3->cardinality != 1) || (*paVar3->array != 0)) || (paVar3->array[1] != 0xffff))
      goto LAB_001155e8;
    }
    else {
      if ((bVar4 != 2) && (bVar4 != 1)) {
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                      ,0x1110,"_Bool container_is_full(const container_t *, uint8_t)");
      }
      if (paVar3->cardinality == 0x10000) goto LAB_00115719;
LAB_001155e8:
      if ((char)local_4c == '\0') {
        if (bVar9 == 4) {
LAB_00115616:
          sc = (array_container_t *)
               shared_container_extract_copy((shared_container_t *)sc,&local_86);
          bVar9 = local_86;
        }
      }
      else {
        if (bVar9 == 4) {
          bVar4 = *(byte *)&sc->array;
          if (bVar4 == 1) goto LAB_00115616;
          if (bVar4 == 4) {
            __assert_fail("*type != SHARED_CONTAINER_TYPE",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                          ,0x1070,
                          "container_t *container_mutable_unwrap_shared(container_t *, uint8_t *)");
          }
          paVar3 = *(array_container_t **)sc;
        }
        else {
          paVar3 = sc;
          bVar4 = bVar9;
          if (bVar9 == 1) {
            bVar9 = 1;
            goto LAB_001156ae;
          }
        }
        switch(bVar4) {
        case 1:
          local_68 = paVar3;
          goto LAB_00115698;
        case 2:
          local_78 = CONCAT71(local_78._1_7_,bVar9);
          local_70 = sc;
          local_68 = (array_container_t *)bitset_container_from_array(paVar3);
          break;
        case 3:
          local_78 = CONCAT71(local_78._1_7_,bVar9);
          local_70 = sc;
          local_68 = (array_container_t *)bitset_container_from_run((run_container_t *)paVar3);
          break;
        case 4:
          __assert_fail("false",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                        ,0x10ae,"bitset_container_t *container_to_bitset(container_t *, uint8_t)");
        default:
          __assert_fail("false",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                        ,0x10b0,"bitset_container_t *container_to_bitset(container_t *, uint8_t)");
        }
        sc = local_70;
        bVar9 = (byte)local_78;
LAB_00115698:
        container_free(sc,bVar9);
        local_86 = 1;
        bVar9 = 1;
        sc = local_68;
      }
LAB_001156ae:
      local_87 = (x2->high_low_container).typecodes[uVar2 & 0xffff];
      paVar3 = (array_container_t *)
               container_lazy_ior(sc,bVar9,(x2->high_low_container).containers[uVar2 & 0xffff],
                                  local_87,&local_85);
      if (paVar3 != sc) {
        container_free(sc,local_86);
      }
      if (ra->size <= i) {
LAB_0011580a:
        __assert_fail("i < ra->size",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                      ,0x1a3a,
                      "void ra_set_container_at_index(const roaring_array_t *, int32_t, container_t *, uint8_t)"
                     );
      }
      ra->containers[(int)local_80 + lVar13] = paVar3;
      ra->typecodes[lVar13 + (int)local_80] = local_85;
    }
LAB_00115719:
    iVar8 = (int)local_60;
    uVar2 = local_80 + lVar13 + 1;
    if ((iVar8 + iVar11 == (uint)uVar2) || (iVar11 + (int)local_48 + iVar12 == 0)) {
      iVar12 = (int)local_40 + iVar11 + 1;
      iVar1 = (int)local_80;
      iVar8 = iVar8 + iVar11;
LAB_00115797:
      if (iVar1 + iVar11 + 1 != iVar8) {
        return;
      }
LAB_0011579b:
      ra_append_copy_range
                (ra,&x2->high_low_container,iVar12,local_84,
                 (_Bool)((x2->high_low_container).flags & 1));
      return;
    }
    local_40 = uVar10 + lVar13 + 1;
    puVar6 = (uint16_t *)((ulong)(((uint)uVar2 & 0xffff) * 2) + (long)ra->keys);
    key = (x2->high_low_container).keys[(uint)local_40 & 0xffff];
LAB_00115770:
    uVar7 = iVar8 + iVar11;
  } while( true );
}

Assistant:

void roaring_bitmap_lazy_or_inplace(roaring_bitmap_t *x1,
                                    const roaring_bitmap_t *x2,
                                    const bool bitsetconversion) {
    uint8_t result_type = 0;
    int length1 = x1->high_low_container.size;
    const int length2 = x2->high_low_container.size;

    if (0 == length2) return;

    if (0 == length1) {
        roaring_bitmap_overwrite(x1, x2);
        return;
    }
    int pos1 = 0, pos2 = 0;
    uint8_t type1, type2;
    uint16_t s1 = ra_get_key_at_index(&x1->high_low_container, pos1);
    uint16_t s2 = ra_get_key_at_index(&x2->high_low_container, pos2);
    while (true) {
        if (s1 == s2) {
            container_t *c1 = ra_get_container_at_index(
                                    &x1->high_low_container, pos1, &type1);
            if (!container_is_full(c1, type1)) {
                if ((bitsetconversion == false) ||
                    (get_container_type(c1, type1) == BITSET_CONTAINER_TYPE)
                ){
                    c1 = get_writable_copy_if_shared(c1, &type1);
                } else {
                    // convert to bitset
                    container_t *old_c1 = c1;
                    uint8_t old_type1 = type1;
                    c1 = container_mutable_unwrap_shared(c1, &type1);
                    c1 = container_to_bitset(c1, type1);
                    container_free(old_c1, old_type1);
                    type1 = BITSET_CONTAINER_TYPE;
                }

                container_t *c2 = ra_get_container_at_index(
                                        &x2->high_low_container, pos2, &type2);
                container_t *c = container_lazy_ior(c1, type1, c2, type2,
                                                    &result_type);

                if (c != c1) {  // in this instance a new container was created,
                                // and we need to free the old one
                    container_free(c1, type1);
                }

                ra_set_container_at_index(&x1->high_low_container, pos1, c,
                                          result_type);
            }
            ++pos1;
            ++pos2;
            if (pos1 == length1) break;
            if (pos2 == length2) break;
            s1 = ra_get_key_at_index(&x1->high_low_container, pos1);
            s2 = ra_get_key_at_index(&x2->high_low_container, pos2);

        } else if (s1 < s2) {  // s1 < s2
            pos1++;
            if (pos1 == length1) break;
            s1 = ra_get_key_at_index(&x1->high_low_container, pos1);

        } else {  // s1 > s2
            container_t *c2 = ra_get_container_at_index(
                                    &x2->high_low_container, pos2, &type2);
            // container_t *c2_clone = container_clone(c2, type2);
            c2 = get_copy_of_container(c2, &type2, is_cow(x2));
            if (is_cow(x2)) {
                ra_set_container_at_index(&x2->high_low_container, pos2, c2,
                                          type2);
            }
            ra_insert_new_key_value_at(&x1->high_low_container, pos1, s2, c2,
                                       type2);
            pos1++;
            length1++;
            pos2++;
            if (pos2 == length2) break;
            s2 = ra_get_key_at_index(&x2->high_low_container, pos2);
        }
    }
    if (pos1 == length1) {
        ra_append_copy_range(&x1->high_low_container, &x2->high_low_container,
                             pos2, length2, is_cow(x2));
    }
}